

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

int fcntl(int __fd,int __cmd,...)

{
  bool bVar1;
  uint uVar2;
  ulong in_RDX;
  rpchook_t *prVar3;
  int iStack_f0;
  va_list arg_list;
  uint local_b8;
  
  if (g_sys_fcntl_func == (fcntl_pfn_t)0x0) {
    g_sys_fcntl_func = (fcntl_pfn_t)dlsym(0xffffffffffffffff);
  }
  if (__fd < 0) {
    return 0x2cf;
  }
  if ((uint)__fd < 1000000) {
    prVar3 = g_rpchook_socket_fd[(uint)__fd];
  }
  else {
    prVar3 = (rpchook_t *)0x0;
  }
  local_b8 = (uint)in_RDX;
  switch(__cmd) {
  case 0:
    iStack_f0 = 0;
    goto LAB_00104cb5;
  case 1:
    uVar2 = (*g_sys_fcntl_func)(__fd,1);
    if ((prVar3 != (rpchook_t *)0x0) && ((prVar3->user_flag & 0x800) == 0)) {
      uVar2 = uVar2 & 0xfffff7ff;
    }
    break;
  case 2:
    iStack_f0 = 2;
    goto LAB_00104cb5;
  case 3:
    iStack_f0 = 3;
    goto LAB_00104b25;
  case 4:
    bVar1 = co_is_enable_sys_hook();
    uVar2 = local_b8 | 0x800;
    if (!bVar1) {
      uVar2 = local_b8;
    }
    if (prVar3 == (rpchook_t *)0x0) {
      uVar2 = local_b8;
    }
    uVar2 = (*g_sys_fcntl_func)(__fd,4,(ulong)uVar2);
    if ((prVar3 != (rpchook_t *)0x0) && (uVar2 == 0)) {
      prVar3->user_flag = local_b8;
      uVar2 = 0;
    }
    break;
  case 5:
    iStack_f0 = 5;
    goto LAB_00104c97;
  case 6:
    iStack_f0 = 6;
    goto LAB_00104c97;
  case 7:
    iStack_f0 = 7;
LAB_00104c97:
    uVar2 = (*g_sys_fcntl_func)(__fd,iStack_f0,in_RDX);
    break;
  case 8:
    iStack_f0 = 8;
LAB_00104cb5:
    uVar2 = (*g_sys_fcntl_func)(__fd,iStack_f0,in_RDX & 0xffffffff);
    break;
  case 9:
    iStack_f0 = 9;
LAB_00104b25:
    uVar2 = (*g_sys_fcntl_func)(__fd,iStack_f0);
    break;
  default:
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

int fcntl(int fildes, int cmd, ...)
{
	HOOK_SYS_FUNC( fcntl );

	if( fildes < 0 )
	{
		return __LINE__;
	}

	va_list arg_list;
	va_start( arg_list,cmd );

	int ret = -1;
	rpchook_t *lp = get_by_fd( fildes );
	switch( cmd )
	{
		case F_DUPFD:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETFD:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
      if (lp && !(lp->user_flag & O_NONBLOCK)) {
          ret = ret & (~O_NONBLOCK);
      }
			break;
		}
		case F_SETFD:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETFL:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
			break;
		}
		case F_SETFL:
		{
			int param = va_arg(arg_list,int);
			int flag = param;
			if( co_is_enable_sys_hook() && lp )
			{
				flag |= O_NONBLOCK;
			}
			ret = g_sys_fcntl_func( fildes,cmd,flag );
			if( 0 == ret && lp )
			{
				lp->user_flag = param;
			}
			break;
		}
		case F_GETOWN:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
			break;
		}
		case F_SETOWN:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETLK:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_SETLK:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_SETLKW:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
	}

	va_end( arg_list );

	return ret;
}